

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# admin.cpp
# Opt level: O0

void Commands::Duty(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *arguments,Character *from)

{
  Player *this;
  Character_Item CVar1;
  World *pWVar2;
  bool bVar3;
  byte bVar4;
  __type _Var5;
  AdminLevel AVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  Config *pCVar10;
  mapped_type *pmVar11;
  vector<Character_*,_std::allocator<Character_*>_> *this_00;
  reference ppCVar12;
  ulong uVar13;
  long lVar14;
  size_type sVar15;
  const_reference subject;
  long lVar16;
  long lVar17;
  long lVar18;
  Map *pMVar19;
  reference pvVar20;
  reference pvVar21;
  reference ppVar22;
  AdminLevel *pAVar23;
  int *piVar24;
  size_type sVar25;
  list<Character_Item,_std::allocator<Character_Item>_> *this_01;
  reference pCVar26;
  __node_base *this_02;
  reference pCVar27;
  byte local_5fa;
  bool local_599;
  string local_548;
  string local_528;
  Character_Spell local_504;
  iterator iStack_500;
  Character_Spell spell;
  iterator __end2_3;
  iterator __begin2_3;
  list<Character_Spell,_std::allocator<Character_Spell>_> *__range2_3;
  Character_Item item_1;
  iterator __end2_2;
  iterator __begin2_2;
  list<Character_Item,_std::allocator<Character_Item>_> *__range2_2;
  string local_4c0 [4];
  int i;
  undefined1 local_4a0 [8];
  PacketBuilder reply_1;
  key_type local_468;
  allocator<char> local_441;
  key_type local_440;
  int local_420;
  allocator<char> local_419;
  key_type local_418;
  int local_3f8;
  allocator<char> local_3f1;
  key_type local_3f0;
  int local_3d0;
  allocator<char> local_3c9;
  key_type local_3c8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int leader_rank;
  value_type_conflict1 item;
  iterator __end2_1;
  iterator __begin2_1;
  array<int,_15UL> *__range2_1;
  key_type local_378;
  allocator<char> local_351;
  key_type local_350;
  allocator<char> local_329;
  key_type local_328;
  string local_308;
  AdminLevel local_2e5 [5];
  undefined1 local_2e0 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
  ac;
  iterator __end2;
  iterator __begin2;
  Config *__range2;
  undefined1 local_260 [7];
  AdminLevel lowest_command;
  string local_240;
  allocator<char> local_219;
  key_type local_218;
  string local_1f8 [32];
  undefined1 local_1d8 [8];
  PacketBuilder reply;
  string guild_rank;
  string guild_str;
  string local_140;
  allocator<char> local_119;
  string local_118;
  string local_f8;
  World *local_d8;
  Character *c;
  iterator __end1;
  iterator __begin1;
  vector<Character_*,_std::allocator<Character_*>_> *__range1;
  World *pWStack_b0;
  bool dutyoff;
  Character *swap;
  Player *player;
  string local_98;
  string local_78;
  allocator<char> local_41;
  key_type local_40;
  World *local_20;
  World *world;
  Character *from_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *arguments_local;
  
  local_20 = from->world;
  pCVar10 = &local_20->config;
  world = (World *)from;
  from_local = (Character *)arguments;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"UseDutyAdmin",&local_41);
  pmVar11 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
            ::operator[](&pCVar10->
                          super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                         ,&local_40);
  bVar3 = util::variant::operator_cast_to_bool(pmVar11);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pWVar2 = world;
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    this = (Player *)
           (world->skills_config).
           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ._M_h._M_element_count;
    pWStack_b0 = (World *)0x0;
    bVar4 = std::__cxx11::string::empty();
    bVar4 = (bVar4 ^ 0xff) & 1;
    this_00 = (vector<Character_*,_std::allocator<Character_*>_> *)
              ((world->skills_config).
               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ._M_h._M_element_count + 0x50);
    __end1 = std::vector<Character_*,_std::allocator<Character_*>_>::begin(this_00);
    c = (Character *)std::vector<Character_*,_std::allocator<Character_*>_>::end(this_00);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                                       *)&c), bVar3) {
      ppCVar12 = __gnu_cxx::
                 __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>
                 ::operator*(&__end1);
      local_d8 = (World *)*ppCVar12;
      if (((bVar4 != 0) &&
          (_Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&(local_d8->timer).timers._M_t._M_impl.super__Rb_tree_header,
                                   &this->dutylast), _Var5)) ||
         ((bVar4 == 0 &&
          ((local_d8 != world && ((local_d8->timer).timers._M_t._M_impl.field_0x4 != ADMIN_PLAYER)))
          ))) {
        uVar13 = std::__cxx11::string::empty();
        if ((uVar13 & 1) == 0) {
          std::__cxx11::string::clear();
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)&this->dutylast,
                     (string *)&(world->timer).timers._M_t._M_impl.super__Rb_tree_header);
        }
        pWStack_b0 = local_d8;
        break;
      }
      __gnu_cxx::
      __normal_iterator<Character_**,_std::vector<Character_*,_std::allocator<Character_*>_>_>::
      operator++(&__end1);
    }
    pWVar2 = world;
    if (pWStack_b0 == (World *)0x0) {
      lVar14 = (**(code **)(*(long *)world + 0x20))();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"character_not_found",&local_119);
      I18N::Format<>(&local_f8,(I18N *)(lVar14 + 0x490),&local_118);
      (**(code **)(*(long *)pWVar2 + 0x28))(pWVar2,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
    }
    else {
      Character::Logout((Character *)world);
      this->character = (Character *)pWStack_b0;
      bVar3 = false;
      local_599 = false;
      if (bVar4 == 0) {
        sVar15 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)from_local);
        local_599 = false;
        if (sVar15 != 0) {
          subject = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)from_local,0);
          util::lowercase(&local_140,subject);
          bVar3 = true;
          local_599 = std::operator==(&local_140,"here");
        }
      }
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_140);
      }
      if (local_599 != false) {
        *(undefined2 *)((long)&pWStack_b0->db + 0x36) = *(undefined2 *)&(world->db).user.field_0x6;
        *(char *)((long)&pWStack_b0->db + 0x38) = (char)(world->db).user._M_string_length;
        *(undefined1 *)((long)&pWStack_b0->db + 0x39) =
             *(undefined1 *)((long)&(world->db).user._M_string_length + 1);
        *(undefined1 *)((long)&pWStack_b0->db + 0x3a) =
             *(undefined1 *)((long)&(world->db).user._M_string_length + 2);
        *(char *)((long)&pWStack_b0->db + 0x8c) = (world->db).db.field_2._M_local_buf[0xc];
      }
      (**(code **)(*(long *)world + 0x10))();
      std::__cxx11::string::operator=
                ((string *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                   *)&pWStack_b0->db + 0xb),(string *)(guild_str.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(guild_str.field_2._M_local_buf + 8));
      World::Login(local_20,(Character *)pWStack_b0);
      Character::CalculateStats((Character *)pWStack_b0,true);
      Character::GuildNameString_abi_cxx11_
                ((string *)((long)&guild_rank.field_2 + 8),(Character *)pWStack_b0);
      Character::GuildRankString_abi_cxx11_((string *)&reply.add_size,(Character *)pWStack_b0);
      sVar15 = std::array<int,_15UL>::size
                         ((array<int,_15UL> *)&(pWStack_b0->shops_config).filename.field_2);
      (**(code **)(*(long *)pWStack_b0 + 0x10))(local_1f8);
      lVar14 = std::__cxx11::string::length();
      lVar16 = std::__cxx11::string::length();
      lVar17 = std::__cxx11::string::length();
      lVar18 = std::__cxx11::string::length();
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_1d8,PACKET_WELCOME,PACKET_REPLY,
                 sVar15 * 2 + 0x72 + lVar14 + lVar16 + lVar17 + lVar18);
      std::__cxx11::string::~string(local_1f8);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,1);
      iVar9 = Character::PlayerID((Character *)pWStack_b0);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,iVar9);
      PacketBuilder::AddInt
                ((PacketBuilder *)local_1d8,*(uint *)&(pWStack_b0->timer).timers._M_t._M_impl);
      PacketBuilder::AddShort
                ((PacketBuilder *)local_1d8,(int)*(short *)((long)&pWStack_b0->db + 0x36));
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"GlobalPK",&local_219)
      ;
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_218);
      bVar3 = util::variant::operator_cast_to_bool(pmVar11);
      local_5fa = 0;
      if (bVar3) {
        bVar3 = World::PKExcept(local_20,(int)*(short *)((long)&pWStack_b0->db + 0x36));
        local_5fa = bVar3 ^ 0xff;
      }
      std::__cxx11::string::~string((string *)&local_218);
      std::allocator<char>::~allocator(&local_219);
      if ((local_5fa & 1) == 0) {
        pMVar19 = World::GetMap(local_20,*(short *)((long)&pWStack_b0->db + 0x36));
        PacketBuilder::AddByte((PacketBuilder *)local_1d8,pMVar19->rid[0]);
        pMVar19 = World::GetMap(local_20,*(short *)((long)&pWStack_b0->db + 0x36));
        PacketBuilder::AddByte((PacketBuilder *)local_1d8,pMVar19->rid[1]);
      }
      else {
        PacketBuilder::AddByte((PacketBuilder *)local_1d8,0xff);
        PacketBuilder::AddByte((PacketBuilder *)local_1d8,'\x01');
      }
      pMVar19 = World::GetMap(local_20,*(short *)((long)&pWStack_b0->db + 0x36));
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,pMVar19->rid[2]);
      pMVar19 = World::GetMap(local_20,*(short *)((long)&pWStack_b0->db + 0x36));
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,pMVar19->rid[3]);
      pMVar19 = World::GetMap(local_20,*(short *)((long)&pWStack_b0->db + 0x36));
      PacketBuilder::AddThree((PacketBuilder *)local_1d8,pMVar19->filesize);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->eif->rid,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->eif->rid,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->eif->rid,2);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->eif->rid,3);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->eif->len,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->eif->len,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->enf->rid,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->enf->rid,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->enf->rid,2);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->enf->rid,3);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->enf->len,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->enf->len,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->esf->rid,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->esf->rid,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->esf->rid,2);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->esf->rid,3);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->esf->len,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->esf->len,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->ecf->rid,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->ecf->rid,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->ecf->rid,2);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar20 = std::array<unsigned_char,_4UL>::operator[](&local_20->ecf->rid,3);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar20);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->ecf->len,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      pvVar21 = std::array<unsigned_char,_2UL>::operator[](&local_20->ecf->len,1);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,*pvVar21);
      (**(code **)(*(long *)pWStack_b0 + 0x10))(&local_240);
      PacketBuilder::AddBreakString((PacketBuilder *)local_1d8,&local_240,0xff);
      std::__cxx11::string::~string((string *)&local_240);
      PacketBuilder::AddBreakString
                ((PacketBuilder *)local_1d8,
                 (string *)
                 &(pWStack_b0->timer).timers._M_t._M_impl.super__Rb_tree_header._M_node_count,0xff);
      PacketBuilder::AddBreakString
                ((PacketBuilder *)local_1d8,(string *)((long)&guild_rank.field_2 + 8),0xff);
      PacketBuilder::AddBreakString((PacketBuilder *)local_1d8,(string *)&reply.add_size,0xff);
      PacketBuilder::AddChar
                ((PacketBuilder *)local_1d8,
                 (uint)(byte)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&pWStack_b0->db)[3]._M_local_buf[0]);
      Character::PaddedGuildTag_abi_cxx11_((string *)local_260,(Character *)pWStack_b0);
      PacketBuilder::AddString((PacketBuilder *)local_1d8,(string *)local_260);
      std::__cxx11::string::~string((string *)local_260);
      __range2._7_1_ = ADMIN_HGM;
      pCVar10 = &local_20->admin_config;
      __end2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::begin(&pCVar10->
                        super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                      );
      ac.second._56_8_ =
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::end(&pCVar10->
                  super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                );
      while (bVar3 = std::__detail::operator!=
                               (&__end2.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_true>
                                  *)&ac.second.type), bVar3) {
        ppVar22 = std::__detail::
                  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
                  ::operator*(&__end2);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                *)local_2e0,ppVar22);
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2e0,"killnpc");
        if ((bVar3) ||
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_2e0,"reports"), bVar3)) {
          local_2e5[1] = ADMIN_HGM|ADMIN_GUIDE;
          local_2e5[2] = ADMIN_PLAYER;
          local_2e5[3] = ADMIN_PLAYER;
          local_2e5[4] = ADMIN_PLAYER;
        }
        else {
          util::variant::operator_cast_to_string
                    (&local_308,(variant *)((long)&ac.first.field_2 + 8));
          iVar9 = util::to_int(&local_308);
          local_2e5[0] = (AdminLevel)iVar9;
          pAVar23 = std::min<AdminLevel>((AdminLevel *)((long)&__range2 + 7),local_2e5);
          __range2._7_1_ = *pAVar23;
          std::__cxx11::string::~string((string *)&local_308);
          local_2e5[1] = ADMIN_PLAYER;
          local_2e5[2] = ADMIN_PLAYER;
          local_2e5[3] = ADMIN_PLAYER;
          local_2e5[4] = ADMIN_PLAYER;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>
                 *)local_2e0);
        std::__detail::
        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_false,_true>
        ::operator++(&__end2);
      }
      bVar4 = (*(code *)**(undefined8 **)pWStack_b0)();
      pCVar10 = &local_20->admin_config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"seehide",&local_329);
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_328);
      iVar9 = util::variant::operator_cast_to_int(pmVar11);
      bVar3 = false;
      if (iVar9 <= (int)(uint)bVar4) {
        bVar4 = (*(code *)**(undefined8 **)pWStack_b0)();
        bVar3 = bVar4 < 4;
      }
      std::__cxx11::string::~string((string *)&local_328);
      std::allocator<char>::~allocator(&local_329);
      if (bVar3) {
        PacketBuilder::AddChar((PacketBuilder *)local_1d8,4);
      }
      else {
        bVar4 = (**(code **)(*(long *)pWStack_b0 + 8))();
        pCVar10 = &local_20->admin_config;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"nowall",&local_351)
        ;
        pmVar11 = std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  ::operator[](&pCVar10->
                                super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                               ,&local_350);
        iVar9 = util::variant::operator_cast_to_int(pmVar11);
        bVar3 = false;
        if (iVar9 <= (int)(uint)bVar4) {
          bVar4 = (**(code **)(*(long *)pWStack_b0 + 8))();
          bVar3 = bVar4 < 3;
        }
        std::__cxx11::string::~string((string *)&local_350);
        std::allocator<char>::~allocator(&local_351);
        if (bVar3) {
          PacketBuilder::AddChar((PacketBuilder *)local_1d8,3);
        }
        else {
          AVar6 = (*(code *)**(undefined8 **)pWStack_b0)();
          if ((AVar6 < __range2._7_1_) ||
             (cVar7 = (*(code *)**(undefined8 **)pWStack_b0)(), cVar7 != '\0')) {
            bVar4 = (*(code *)**(undefined8 **)pWStack_b0)();
            PacketBuilder::AddChar((PacketBuilder *)local_1d8,(uint)bVar4);
          }
          else {
            PacketBuilder::AddChar((PacketBuilder *)local_1d8,1);
          }
        }
      }
      PacketBuilder::AddChar
                ((PacketBuilder *)local_1d8,(uint)*(byte *)((long)&pWStack_b0->db + 0x3b));
      PacketBuilder::AddInt((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->db + 0x3c));
      PacketBuilder::AddInt((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->db + 0xa4));
      PacketBuilder::AddShort
                ((PacketBuilder *)local_1d8,
                 *(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                           *)&pWStack_b0->db + 4));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)&pWStack_b0->esf);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->db + 0x44));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->esf + 4));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->enf + 4));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->db + 0x78));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->db + 0x7c));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->db + 0x88));
      PacketBuilder::AddShort
                ((PacketBuilder *)local_1d8,
                 *(int *)((long)&(pWStack_b0->npc_data).
                                 super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4));
      PacketBuilder::AddShort
                ((PacketBuilder *)local_1d8,
                 *(int *)&(pWStack_b0->npc_data).
                          super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)&pWStack_b0->ecf);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,*(int *)((long)&pWStack_b0->ecf + 4));
      PacketBuilder::AddShort
                ((PacketBuilder *)local_1d8,
                 *(int *)&(pWStack_b0->npc_data).
                          super__Vector_base<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>,_std::allocator<std::unique_ptr<NPC_Data,_std::default_delete<NPC_Data>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,"OldVersionCompat",(allocator<char> *)((long)&__range2_1 + 7))
      ;
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_378);
      bVar8 = util::variant::operator_cast_to_bool(pmVar11);
      bVar3 = false;
      if (!bVar8) {
        bVar3 = this->client->version < 0x1c;
      }
      std::__cxx11::string::~string((string *)&local_378);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2_1 + 7));
      if (bVar3) {
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,
                   **(int **)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&pWStack_b0->formulas_cache + 2));
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,
                   **(int **)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&pWStack_b0->formulas_cache + 3));
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,**(int **)((long)&pWStack_b0->formulas_cache + 0x28));
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,
                   *(int *)&((pWStack_b0->i18n).lang_config._M_t.
                             super___uniq_ptr_impl<Config,_std::default_delete<Config>_>._M_t.
                             super__Tuple_impl<0UL,_Config_*,_std::default_delete<Config>_>.
                             super__Head_base<0UL,_Config_*,_false>._M_head_impl)->
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  );
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,
                   *(int *)(pWStack_b0->characters).
                           super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                           super__Vector_impl_data._M_start);
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,
                   *(int *)(pWStack_b0->characters).
                           super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      else {
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1d8,
                   **(int **)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&pWStack_b0->formulas_cache + 2));
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1d8,
                   **(int **)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&pWStack_b0->formulas_cache + 3));
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1d8,**(int **)((long)&pWStack_b0->formulas_cache + 0x28));
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1d8,
                   *(int *)&((pWStack_b0->i18n).lang_config._M_t.
                             super___uniq_ptr_impl<Config,_std::default_delete<Config>_>._M_t.
                             super__Tuple_impl<0UL,_Config_*,_std::default_delete<Config>_>.
                             super__Head_base<0UL,_Config_*,_false>._M_head_impl)->
                            super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                  );
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1d8,
                   *(int *)(pWStack_b0->characters).
                           super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                           super__Vector_impl_data._M_start);
        PacketBuilder::AddShort
                  ((PacketBuilder *)local_1d8,
                   *(int *)(pWStack_b0->characters).
                           super__Vector_base<Character_*,_std::allocator<Character_*>_>._M_impl.
                           super__Vector_impl_data._M_finish);
      }
      __begin2_1 = (iterator)&(pWStack_b0->shops_config).filename.field_2;
      __end2_1 = std::array<int,_15UL>::begin((array<int,_15UL> *)__begin2_1);
      _leader_rank = std::array<int,_15UL>::end((array<int,_15UL> *)__begin2_1);
      for (; __end2_1 != _leader_rank; __end2_1 = __end2_1 + 1) {
        local_39c = *__end2_1;
        PacketBuilder::AddShort((PacketBuilder *)local_1d8,local_39c);
      }
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3c8,"GuildEditRank",&local_3c9);
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_3c8);
      local_3a4 = util::variant::operator_cast_to_int(pmVar11);
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_3f0,"GuildKickRank",&local_3f1);
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_3f0);
      local_3d0 = util::variant::operator_cast_to_int(pmVar11);
      piVar24 = std::max<int>(&local_3a4,&local_3d0);
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_418,"GuildPromoteRank",&local_419);
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_418);
      local_3f8 = util::variant::operator_cast_to_int(pmVar11);
      piVar24 = std::max<int>(piVar24,&local_3f8);
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_440,"GuildDemoteRank",&local_441);
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_440);
      local_420 = util::variant::operator_cast_to_int(pmVar11);
      piVar24 = std::max<int>(piVar24,&local_420);
      iVar9 = *piVar24;
      std::__cxx11::string::~string((string *)&local_440);
      std::allocator<char>::~allocator(&local_441);
      std::__cxx11::string::~string((string *)&local_418);
      std::allocator<char>::~allocator(&local_419);
      std::__cxx11::string::~string((string *)&local_3f0);
      std::allocator<char>::~allocator(&local_3f1);
      std::__cxx11::string::~string((string *)&local_3c8);
      std::allocator<char>::~allocator(&local_3c9);
      local_3a0 = iVar9;
      if ((iVar9 < (int)(uint)(byte)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                                      *)&pWStack_b0->skills_config)[4]._M_local_buf[0]) ||
         (bVar3 = std::__shared_ptr::operator_cast_to_bool
                            ((__shared_ptr *)
                             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                               *)&pWStack_b0->skills_config + 2)), !bVar3)) {
        PacketBuilder::AddChar
                  ((PacketBuilder *)local_1d8,
                   (uint)(byte)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                                 *)&pWStack_b0->skills_config)[4]._M_local_buf[0]);
      }
      else {
        PacketBuilder::AddChar((PacketBuilder *)local_1d8,1);
      }
      pCVar10 = &local_20->config;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_468,"JailMap",(allocator<char> *)((long)&reply_1.add_size + 7));
      pmVar11 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                ::operator[](&pCVar10->
                              super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                             ,&local_468);
      iVar9 = util::variant::operator_cast_to_int(pmVar11);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,iVar9);
      std::__cxx11::string::~string((string *)&local_468);
      std::allocator<char>::~allocator((allocator<char> *)((long)&reply_1.add_size + 7));
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,4);
      PacketBuilder::AddChar((PacketBuilder *)local_1d8,0x18);
      PacketBuilder::AddChar((PacketBuilder *)local_1d8,0x18);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,0);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,0);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,0);
      PacketBuilder::AddShort((PacketBuilder *)local_1d8,2);
      PacketBuilder::AddChar((PacketBuilder *)local_1d8,0);
      PacketBuilder::AddByte((PacketBuilder *)local_1d8,0xff);
      Player::Send(this,(PacketBuilder *)local_1d8);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_1d8);
      std::__cxx11::string::~string((string *)&reply.add_size);
      std::__cxx11::string::~string((string *)(guild_rank.field_2._M_local_buf + 8));
      (**(code **)(*(long *)pWStack_b0 + 0x10))();
      lVar14 = std::__cxx11::string::length();
      sVar15 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::size
                         ((list<Character_Item,_std::allocator<Character_Item>_> *)
                          &(pWStack_b0->shops_config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ._M_h._M_element_count);
      sVar25 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::size
                         ((list<Character_Spell,_std::allocator<Character_Spell>_> *)
                          &(pWStack_b0->formulas_config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                           ._M_h._M_before_begin);
      PacketBuilder::PacketBuilder
                ((PacketBuilder *)local_4a0,PACKET_WELCOME,PACKET_REPLY,
                 lVar14 + sVar15 * 6 + 0x41 + sVar25 * 4);
      std::__cxx11::string::~string(local_4c0);
      PacketBuilder::AddShort((PacketBuilder *)local_4a0,2);
      PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      for (__range2_2._4_4_ = 0; __range2_2._4_4_ < 9; __range2_2._4_4_ = __range2_2._4_4_ + 1) {
        PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      }
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,
                 *(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                           *)&pWStack_b0->db + 8));
      PacketBuilder::AddChar((PacketBuilder *)local_4a0,*(int *)((long)&pWStack_b0->db + 0x84));
      this_01 = (list<Character_Item,_std::allocator<Character_Item>_> *)
                &(pWStack_b0->shops_config).
                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ._M_h._M_element_count;
      __end2_2 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::begin(this_01)
      ;
      item_1 = (Character_Item)
               std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::end(this_01);
      while (bVar3 = std::operator!=(&__end2_2,(_Self *)&item_1), bVar3) {
        pCVar26 = std::_List_iterator<Character_Item>::operator*(&__end2_2);
        CVar1 = *pCVar26;
        __range2_3._0_2_ = CVar1.id;
        PacketBuilder::AddShort((PacketBuilder *)local_4a0,(int)(short)__range2_3);
        __range2_3._4_4_ = CVar1.amount;
        PacketBuilder::AddInt((PacketBuilder *)local_4a0,__range2_3._4_4_);
        std::_List_iterator<Character_Item>::operator++(&__end2_2);
      }
      PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      this_02 = &(pWStack_b0->formulas_config).
                 super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ._M_h._M_before_begin;
      __end2_3 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::begin
                           ((list<Character_Spell,_std::allocator<Character_Spell>_> *)this_02);
      iStack_500 = std::__cxx11::list<Character_Spell,_std::allocator<Character_Spell>_>::end
                             ((list<Character_Spell,_std::allocator<Character_Spell>_> *)this_02);
      while (bVar3 = std::operator!=(&__end2_3,&stack0xfffffffffffffb00), bVar3) {
        pCVar27 = std::_List_iterator<Character_Spell>::operator*(&__end2_3);
        local_504 = *pCVar27;
        PacketBuilder::AddShort((PacketBuilder *)local_4a0,(int)local_504.id);
        PacketBuilder::AddShort((PacketBuilder *)local_4a0,(uint)local_504 >> 0x10 & 0xff);
        std::_List_iterator<Character_Spell>::operator++(&__end2_3);
      }
      PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      PacketBuilder::AddChar((PacketBuilder *)local_4a0,1);
      PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      (**(code **)(*(long *)pWStack_b0 + 0x10))(&local_528);
      PacketBuilder::AddBreakString((PacketBuilder *)local_4a0,&local_528,0xff);
      std::__cxx11::string::~string((string *)&local_528);
      iVar9 = Character::PlayerID((Character *)pWStack_b0);
      PacketBuilder::AddShort((PacketBuilder *)local_4a0,iVar9);
      PacketBuilder::AddShort
                ((PacketBuilder *)local_4a0,(int)*(short *)((long)&pWStack_b0->db + 0x36));
      PacketBuilder::AddShort
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x38));
      PacketBuilder::AddShort
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x39));
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x3a));
      PacketBuilder::AddChar((PacketBuilder *)local_4a0,6);
      Character::PaddedGuildTag_abi_cxx11_(&local_548,(Character *)pWStack_b0);
      PacketBuilder::AddString((PacketBuilder *)local_4a0,&local_548);
      std::__cxx11::string::~string((string *)&local_548);
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x3b));
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x31));
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x33));
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x34));
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x32));
      PacketBuilder::AddShort((PacketBuilder *)local_4a0,*(int *)&pWStack_b0->esf);
      PacketBuilder::AddShort
                ((PacketBuilder *)local_4a0,
                 *(int *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                           *)&pWStack_b0->db + 4));
      PacketBuilder::AddShort((PacketBuilder *)local_4a0,*(int *)((long)&pWStack_b0->esf + 4));
      PacketBuilder::AddShort((PacketBuilder *)local_4a0,*(int *)((long)&pWStack_b0->db + 0x44));
      Character::AddPaperdollData((Character *)pWStack_b0,(PacketBuilder *)local_4a0,"B000A0HSW");
      PacketBuilder::AddChar
                ((PacketBuilder *)local_4a0,(uint)*(byte *)((long)&pWStack_b0->db + 0x8c));
      bVar3 = Character::IsHideInvisible((Character *)pWStack_b0);
      PacketBuilder::AddChar((PacketBuilder *)local_4a0,(uint)bVar3);
      PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      PacketBuilder::AddByte((PacketBuilder *)local_4a0,0xff);
      Player::Send(this,(PacketBuilder *)local_4a0);
      PacketBuilder::~PacketBuilder((PacketBuilder *)local_4a0);
      Character::Warp((Character *)pWStack_b0,*(short *)((long)&pWStack_b0->db + 0x36),
                      *(uchar *)((long)&pWStack_b0->db + 0x38),
                      *(uchar *)((long)&pWStack_b0->db + 0x39),WARP_ANIMATION_NONE);
    }
  }
  else {
    lVar14 = (**(code **)(*(long *)world + 0x20))();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"unknown_command",(allocator<char> *)((long)&player + 7));
    I18N::Format<>(&local_78,(I18N *)(lVar14 + 0x490),&local_98);
    (**(code **)(*(long *)pWVar2 + 0x28))(pWVar2,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator((allocator<char> *)((long)&player + 7));
  }
  return;
}

Assistant:

void Duty(const std::vector<std::string>& arguments, Character* from)
{
	World* world = from->world;

	if (!world->config["UseDutyAdmin"])
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("unknown_command"));
		return;
	}

	Player* player = from->player;
	Character* swap = nullptr;

	bool dutyoff = !player->dutylast.empty();

	for (Character* c : from->player->characters)
	{
		if ((dutyoff && c->real_name == player->dutylast)
		 || (!dutyoff && c != from && c->admin))
		{
			if (player->dutylast.empty())
				player->dutylast = from->real_name;
			else
				player->dutylast.clear();

			swap = c;
			break;
		}
	}

	if (!swap)
	{
		from->ServerMsg(from->SourceWorld()->i18n.Format("character_not_found"));
		return;
	}

	from->Logout();
	player->character = swap;

	if (!dutyoff && arguments.size() > 0 && util::lowercase(arguments[0]) == "here")
	{
		swap->mapid = from->mapid;
		swap->x = from->x;
		swap->y = from->y;
		swap->direction = from->direction;
		swap->sitting = from->sitting;
	}

	swap->faux_name = from->SourceName();

	world->Login(swap);
	swap->CalculateStats();

	{
		std::string guild_str = swap->GuildNameString();
		std::string guild_rank = swap->GuildRankString();

		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY,
			114 + swap->paperdoll.size() * 2 + swap->SourceName().length() + swap->title.length()
			+ guild_str.length() + guild_rank.length());

		reply.AddShort(1); // REPLY_WELCOME sub-id
		reply.AddShort(swap->PlayerID());
		reply.AddInt(swap->id);
		reply.AddShort(swap->mapid); // Map ID

		if (world->config["GlobalPK"] && !world->PKExcept(swap->mapid))
		{
			reply.AddByte(0xFF);
			reply.AddByte(0x01);
		}
		else
		{
			reply.AddByte(world->GetMap(swap->mapid)->rid[0]);
			reply.AddByte(world->GetMap(swap->mapid)->rid[1]);
		}

		reply.AddByte(world->GetMap(swap->mapid)->rid[2]);
		reply.AddByte(world->GetMap(swap->mapid)->rid[3]);
		reply.AddThree(world->GetMap(swap->mapid)->filesize);
		reply.AddByte(world->eif->rid[0]);
		reply.AddByte(world->eif->rid[1]);
		reply.AddByte(world->eif->rid[2]);
		reply.AddByte(world->eif->rid[3]);
		reply.AddByte(world->eif->len[0]);
		reply.AddByte(world->eif->len[1]);
		reply.AddByte(world->enf->rid[0]);
		reply.AddByte(world->enf->rid[1]);
		reply.AddByte(world->enf->rid[2]);
		reply.AddByte(world->enf->rid[3]);
		reply.AddByte(world->enf->len[0]);
		reply.AddByte(world->enf->len[1]);
		reply.AddByte(world->esf->rid[0]);
		reply.AddByte(world->esf->rid[1]);
		reply.AddByte(world->esf->rid[2]);
		reply.AddByte(world->esf->rid[3]);
		reply.AddByte(world->esf->len[0]);
		reply.AddByte(world->esf->len[1]);
		reply.AddByte(world->ecf->rid[0]);
		reply.AddByte(world->ecf->rid[1]);
		reply.AddByte(world->ecf->rid[2]);
		reply.AddByte(world->ecf->rid[3]);
		reply.AddByte(world->ecf->len[0]);
		reply.AddByte(world->ecf->len[1]);
		reply.AddBreakString(swap->SourceName());
		reply.AddBreakString(swap->title);
		reply.AddBreakString(guild_str); // Guild Name
		reply.AddBreakString(guild_rank); // Guild Rank
		reply.AddChar(swap->clas);
		reply.AddString(swap->PaddedGuildTag());

		// Tell a player's client they're a higher level admin than they are to enable some features

		AdminLevel lowest_command = ADMIN_HGM;

		UTIL_FOREACH(world->admin_config, ac)
		{
			if (ac.first == "killnpc" || ac.first == "reports")
			{
				continue;
			}

			lowest_command = std::min<AdminLevel>(lowest_command, static_cast<AdminLevel>(util::to_int(ac.second)));
		}

		if (swap->SourceAccess() >= static_cast<int>(world->admin_config["seehide"])
		 && swap->SourceAccess() < ADMIN_HGM)
		{
			reply.AddChar(ADMIN_HGM);
		}
		else if (swap->SourceDutyAccess() >= static_cast<int>(world->admin_config["nowall"])
		 && swap->SourceDutyAccess() < ADMIN_GM)
		{
			reply.AddChar(ADMIN_GM);
		}
		else if (swap->SourceAccess() >= lowest_command
		 && swap->SourceAccess() < ADMIN_GUIDE)
		{
			reply.AddChar(ADMIN_GUIDE);
		}
		else
		{
			reply.AddChar(swap->SourceAccess());
		}

		reply.AddChar(swap->level);
		reply.AddInt(swap->exp);
		reply.AddInt(swap->usage);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->tp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->maxsp);
		reply.AddShort(swap->statpoints);
		reply.AddShort(swap->skillpoints);
		reply.AddShort(swap->karma);
		reply.AddShort(swap->mindam);
		reply.AddShort(swap->maxdam);
		reply.AddShort(swap->accuracy);
		reply.AddShort(swap->evade);
		reply.AddShort(swap->armor);

		if (!world->config["OldVersionCompat"] && player->client->version < 28)
		{
			reply.AddChar(swap->display_str);
			reply.AddChar(swap->display_wis);
			reply.AddChar(swap->display_intl);
			reply.AddChar(swap->display_agi);
			reply.AddChar(swap->display_con);
			reply.AddChar(swap->display_cha);
		}
		else
		{
			reply.AddShort(swap->display_str);
			reply.AddShort(swap->display_wis);
			reply.AddShort(swap->display_intl);
			reply.AddShort(swap->display_agi);
			reply.AddShort(swap->display_con);
			reply.AddShort(swap->display_cha);
		}

		UTIL_FOREACH(swap->paperdoll, item)
		{
			reply.AddShort(item);
		}

		int leader_rank = std::max(std::max(std::max(static_cast<int>(world->config["GuildEditRank"]), static_cast<int>(world->config["GuildKickRank"])),
								   static_cast<int>(world->config["GuildPromoteRank"])), static_cast<int>(world->config["GuildDemoteRank"]));

		if (swap->guild_rank <= leader_rank && swap->guild)
		{
			reply.AddChar(1); // Allows client access to the guild management tools
		}
		else
		{
			reply.AddChar(swap->guild_rank);
		}

		reply.AddShort(static_cast<int>(world->config["JailMap"]));
		reply.AddShort(4); // ?
		reply.AddChar(24); // ?
		reply.AddChar(24); // ?
		reply.AddShort(0); // Light guide admin command flood rate
		reply.AddShort(0); // Guardian admin command flood rate
		reply.AddShort(0); // GM/HGM admin command flood rate
		reply.AddShort(2); // ?
		reply.AddChar(0); // Login warning message
		reply.AddByte(255);

		player->Send(reply);
	}

	{
		PacketBuilder reply(PACKET_WELCOME, PACKET_REPLY, 65 + swap->SourceName().length() + swap->inventory.size() * 6 + swap->spells.size() * 4);

		reply.AddShort(2); // REPLY_WELCOME sub-id
		// MotDs
		reply.AddByte(255);

		for (int i = 0; i < 9; ++i)
		{
			reply.AddByte(255);
		}

		// ??
		reply.AddChar(swap->weight); // Weight
		reply.AddChar(swap->maxweight); // Max Weight
		UTIL_FOREACH(swap->inventory, item)
		{
			reply.AddShort(item.id);
			reply.AddInt(item.amount);
		}
		reply.AddByte(255);
		UTIL_FOREACH(swap->spells, spell)
		{
			reply.AddShort(spell.id); // Spell ID
			reply.AddShort(spell.level); // Spell Level
		}
		reply.AddByte(255);

		reply.AddChar(1); // Number of players
		reply.AddByte(255);

		reply.AddBreakString(swap->SourceName());
		reply.AddShort(swap->PlayerID());
		reply.AddShort(swap->mapid);
		reply.AddShort(swap->x);
		reply.AddShort(swap->y);
		reply.AddChar(swap->direction);
		reply.AddChar(6); // ?
		reply.AddString(swap->PaddedGuildTag());
		reply.AddChar(swap->level);
		reply.AddChar(swap->gender);
		reply.AddChar(swap->hairstyle);
		reply.AddChar(swap->haircolor);
		reply.AddChar(swap->race);
		reply.AddShort(swap->maxhp);
		reply.AddShort(swap->hp);
		reply.AddShort(swap->maxtp);
		reply.AddShort(swap->tp);
		swap->AddPaperdollData(reply, "B000A0HSW");
		reply.AddChar(swap->sitting);
		reply.AddChar(swap->IsHideInvisible());
		reply.AddByte(255);

		reply.AddByte(255);

		player->Send(reply);
	}

	swap->Warp(swap->mapid, swap->x, swap->y, WARP_ANIMATION_NONE);
}